

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_mode_cache_for_partition_ab
               (MB_MODE_INFO **mode_cache,PC_TREE *pc_tree,AB_PART_TYPE ab_part_type)

{
  MB_MODE_INFO **dst_mode;
  byte in_DL;
  long in_RSI;
  MB_MODE_INFO **in_RDI;
  PC_TREE *in_stack_ffffffffffffffd8;
  
  dst_mode = (MB_MODE_INFO **)(ulong)in_DL;
  switch(dst_mode) {
  case (MB_MODE_INFO **)0x0:
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_mode_context(in_RDI + 2,*(PICK_MODE_CONTEXT **)(in_RSI + 0x18));
    break;
  case (MB_MODE_INFO **)0x1:
    copy_partition_mode_from_mode_context(in_RDI,*(PICK_MODE_CONTEXT **)(in_RSI + 0x10));
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    break;
  case (MB_MODE_INFO **)0x2:
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_mode_context(in_RDI + 2,*(PICK_MODE_CONTEXT **)(in_RSI + 0x28));
    break;
  case (MB_MODE_INFO **)0x3:
    copy_partition_mode_from_mode_context(in_RDI,*(PICK_MODE_CONTEXT **)(in_RSI + 0x20));
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
    copy_partition_mode_from_pc_tree(dst_mode,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static inline void set_mode_cache_for_partition_ab(
    const MB_MODE_INFO **mode_cache, const PC_TREE *pc_tree,
    AB_PART_TYPE ab_part_type) {
  switch (ab_part_type) {
    case HORZ_A:
      copy_partition_mode_from_pc_tree(&mode_cache[0], pc_tree->split[0]);
      copy_partition_mode_from_pc_tree(&mode_cache[1], pc_tree->split[1]);
      copy_partition_mode_from_mode_context(&mode_cache[2],
                                            pc_tree->horizontal[1]);
      break;
    case HORZ_B:
      copy_partition_mode_from_mode_context(&mode_cache[0],
                                            pc_tree->horizontal[0]);
      copy_partition_mode_from_pc_tree(&mode_cache[1], pc_tree->split[2]);
      copy_partition_mode_from_pc_tree(&mode_cache[2], pc_tree->split[3]);
      break;
    case VERT_A:
      copy_partition_mode_from_pc_tree(&mode_cache[0], pc_tree->split[0]);
      copy_partition_mode_from_pc_tree(&mode_cache[1], pc_tree->split[2]);
      copy_partition_mode_from_mode_context(&mode_cache[2],
                                            pc_tree->vertical[1]);
      break;
    case VERT_B:
      copy_partition_mode_from_mode_context(&mode_cache[0],
                                            pc_tree->vertical[0]);
      copy_partition_mode_from_pc_tree(&mode_cache[1], pc_tree->split[1]);
      copy_partition_mode_from_pc_tree(&mode_cache[2], pc_tree->split[3]);
      break;
    default: assert(0 && "Invalid ab partition type!\n");
  }
}